

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

byte * __thiscall
Js::ByteCodeBufferReader::ReadStringConstant
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function,LPCWSTR *string,
          uint32 *len)

{
  uint32 uVar1;
  undefined8 in_RAX;
  byte *pbVar2;
  LPCWSTR pWVar3;
  int local_34 [2];
  int stringId;
  
  local_34[0] = (int)((ulong)in_RAX >> 0x20);
  pbVar2 = ReadInt32(current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),local_34)
  ;
  pWVar3 = GetString16ById(this,local_34[0],(bool *)0x0);
  *string = pWVar3;
  uVar1 = GetString16LengthById(this,local_34[0]);
  *len = uVar1;
  return pbVar2;
}

Assistant:

const byte* ReadStringConstant(const byte* current, FunctionBody* function, _Out_ LPCWSTR * string, _Out_ uint32 * len)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartStringConstant);
#endif
        int stringId;
        current = ReadInt32(current, &stringId);
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndStringConstant);
#endif
        *string = GetString16ById(stringId);
        *len = GetString16LengthById(stringId);

        return current;
    }